

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetimeedit.cpp
# Opt level: O1

void __thiscall QDateTimeEdit::setMinimumDateTime(QDateTimeEdit *this,QDateTime *dt)

{
  long *plVar1;
  char cVar2;
  long lVar3;
  QDateTime *pQVar4;
  long in_FS_OFFSET;
  QDateTime max;
  QDateTime m;
  undefined1 *local_80;
  undefined1 *local_78;
  QVariant local_70;
  anon_union_24_3_e3d07ef4_for_data local_50;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  plVar1 = *(long **)&(this->super_QAbstractSpinBox).super_QWidget.field_0x8;
  cVar2 = QDateTime::isValid();
  if (cVar2 != '\0') {
    lVar3 = QDateTime::date();
    QDate::QDate((QDate *)&local_50.shared,100,1,1);
    if ((long)local_50.shared <= lVar3) {
      local_78 = &DAT_aaaaaaaaaaaaaaaa;
      QDateTime::toTimeZone((QTimeZone *)&local_78);
      local_80 = &DAT_aaaaaaaaaaaaaaaa;
      ::QVariant::toDateTime();
      ::QVariant::QVariant((QVariant *)&local_50,(QDateTime *)&local_78);
      cVar2 = compareThreeWay((QDateTime *)&local_80,(QDateTime *)&local_78);
      pQVar4 = (QDateTime *)&local_78;
      if ('\0' < cVar2) {
        pQVar4 = (QDateTime *)&local_80;
      }
      ::QVariant::QVariant(&local_70,pQVar4);
      (**(code **)(*plVar1 + 0xb0))(plVar1,&local_50,&local_70);
      ::QVariant::~QVariant(&local_70);
      ::QVariant::~QVariant((QVariant *)&local_50);
      QDateTime::~QDateTime((QDateTime *)&local_80);
      QDateTime::~QDateTime((QDateTime *)&local_78);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QDateTimeEdit::setMinimumDateTime(const QDateTime &dt)
{
    Q_D(QDateTimeEdit);
    if (dt.isValid() && dt.date() >= QDATETIMEEDIT_DATE_MIN) {
        const QDateTime m = dt.toTimeZone(d->timeZone);
        const QDateTime max = d->maximum.toDateTime();
        d->setRange(m, (max > m ? max : m));
    }
}